

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointSubscribe(HelicsEndpoint endpoint,char *key,HelicsError *err)

{
  Endpoint *this;
  undefined8 *puVar1;
  size_t sVar2;
  bool bVar3;
  string_view key_00;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (endpoint == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001ae979;
    }
    else {
      bVar3 = *(int *)((long)endpoint + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar3) {
        puVar1 = (undefined8 *)endpoint;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_001ae97b;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001ae979:
  puVar1 = (undefined8 *)0x0;
LAB_001ae97b:
  if (puVar1 != (undefined8 *)0x0) {
    if (key == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      this = (Endpoint *)*puVar1;
      sVar2 = strlen(key);
      key_00._M_str = key;
      key_00._M_len = sVar2;
      helics::Endpoint::subscribe(this,key_00);
    }
  }
  return;
}

Assistant:

void helicsEndpointSubscribe(HelicsEndpoint endpoint, const char* key, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(key, void());
    try {
        endObj->endPtr->subscribe(key);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}